

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitor_UNIX.cpp
# Opt level: O2

bool __thiscall FIX::SocketMonitor::addWrite(SocketMonitor *this,socket_handle s)

{
  iterator iVar1;
  socket_handle local_1c;
  
  local_1c = s;
  iVar1 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                    (&(this->m_readSockets)._M_t,&local_1c);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->m_readSockets)._M_t._M_impl.super__Rb_tree_header)
  {
    socket_setnonblock(local_1c);
    iVar1 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                      (&(this->m_writeSockets)._M_t,&local_1c);
    if ((_Rb_tree_header *)iVar1._M_node ==
        &(this->m_writeSockets)._M_t._M_impl.super__Rb_tree_header) {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &this->m_writeSockets,&local_1c);
      return true;
    }
  }
  return false;
}

Assistant:

bool SocketMonitor::addWrite(socket_handle s) {
  if (m_readSockets.find(s) == m_readSockets.end()) {
    return false;
  }

  socket_setnonblock(s);
  Sockets::iterator i = m_writeSockets.find(s);
  if (i != m_writeSockets.end()) {
    return false;
  }

  m_writeSockets.insert(s);
  return true;
}